

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserValidationErrorTest_Proto3JsonConflictError_Test::
~ParserValidationErrorTest_Proto3JsonConflictError_Test
          (ParserValidationErrorTest_Proto3JsonConflictError_Test *this)

{
  ParserTest::~ParserTest(&this->super_ParserValidationErrorTest);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, Proto3JsonConflictError) {
  ExpectHasValidationErrors(
      "syntax = 'proto3';\n"
      "message TestMessage {\n"
      "  uint32 _foo = 1;\n"
      "  uint32 Foo = 2;\n"
      "}\n",
      "3:9: The default JSON name of field \"Foo\" (\"Foo\") conflicts "
      "with the default JSON name of field \"_foo\".\n");
}